

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::iterate(PartialUpdateTest *this)

{
  TestContext *this_00;
  int iVar1;
  pointer pDVar2;
  pointer pFVar3;
  pointer piVar4;
  pointer piVar5;
  bool bVar6;
  EGLint EVar7;
  EGLint EVar8;
  deUint32 dVar9;
  Library *egl;
  pointer pFVar10;
  pointer pFVar11;
  ostream *this_01;
  pointer *ppiVar12;
  pointer piVar13;
  undefined8 extraout_RAX;
  void *pvVar14;
  int **ppiVar15;
  int iVar16;
  ulong uVar17;
  int **ppiVar18;
  Frame *__args;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  Frame *pFVar19;
  Frame *extraout_RDX_01;
  Frame *frame;
  char *description;
  int **ppiVar20;
  int iVar21;
  ulong uVar22;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes;
  ulong uVar23;
  pointer pFVar24;
  pointer __a;
  ulong uVar25;
  pointer piVar26;
  float fVar27;
  float fVar28;
  EGLint currentBufferAge;
  vector<int,_std::allocator<int>_> framesOnBuffer;
  Vec4 clearColor;
  vector<int,_std::allocator<int>_> bufferAges;
  FrameSequence frameSequence;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  Random rnd;
  ostringstream stream;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  int **local_298;
  iterator iStack_290;
  int *local_288 [2];
  Vec4 local_278;
  void *local_268;
  iterator iStack_260;
  int *local_258;
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  local_248;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *local_228;
  Frame local_220;
  ulong local_200;
  Surface local_1f8;
  TestLog *local_1e0;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *local_1d8;
  Surface local_1d0;
  deRandom local_1b8;
  vector<int,_std::allocator<int>_> local_1a8 [4];
  ios_base local_138 [264];
  
  deRandom_init(&local_1b8,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1e0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  EVar7 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  EVar8 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar27 = deRandom_getFloat(&local_1b8);
  fVar28 = deRandom_getFloat(&local_1b8);
  local_228 = (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
               *)CONCAT44(local_228._4_4_,fVar28);
  local_278.m_data[2] = deRandom_getFloat(&local_1b8);
  local_278.m_data[1] = local_228._0_4_;
  local_278.m_data[3] = 1.0;
  local_248.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258 = (int *)0x0;
  local_268 = (void *)0x0;
  iStack_260._M_current = (int *)0x0;
  local_278.m_data[0] = fVar27;
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
  dVar9 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar9,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                   ,499);
  __a = (pointer)0x0;
  local_228 = &this->m_oddFrameDrawType;
  local_1d8 = &this->m_evenFrameDrawType;
  uVar22 = 0;
  local_200 = 0;
  local_2a0 = EVar7;
  local_29c = EVar8;
  do {
    iVar1 = local_29c;
    iVar21 = local_2a0;
    tcu::Surface::Surface(&local_1d0,local_2a0,local_29c);
    tcu::Surface::Surface(&local_1f8,iVar21,iVar1);
    local_220.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_220.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_220.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a4 = 0xffffffff;
    drawTypes = local_228;
    if ((uVar22 & 1) == 0) {
      drawTypes = local_1d8;
    }
    local_220.width = iVar21;
    local_220.height = iVar1;
    generateRandomFrame(&local_220,drawTypes,(Random *)&local_1b8);
    pFVar3 = local_248.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__a == local_248.
               super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)__a -
          (long)local_248.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar23 = (long)__a -
               (long)local_248.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar17 = uVar23;
      if (__a == local_248.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        uVar17 = 1;
      }
      uVar25 = uVar17 + uVar23;
      if (0x3fffffffffffffe < uVar25) {
        uVar25 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar17,uVar23)) {
        uVar25 = 0x3ffffffffffffff;
      }
      if (uVar25 == 0) {
        pFVar10 = (pointer)0x0;
        pFVar19 = __args;
      }
      else {
        pFVar10 = (pointer)operator_new(uVar25 << 5);
        pFVar19 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(pFVar10 + uVar23),&local_220,pFVar19);
      pFVar24 = pFVar10;
      for (pFVar11 = pFVar3; __a != pFVar11; pFVar11 = pFVar11 + 1) {
        iVar21 = pFVar11->height;
        pFVar24->width = pFVar11->width;
        pFVar24->height = iVar21;
        pDVar2 = (pFVar11->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (pFVar24->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pFVar11->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pFVar24->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar2;
        (pFVar24->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pFVar11->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar11->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar11->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar11->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar24 = pFVar24 + 1;
      }
      if (pFVar3 != (pointer)0x0) {
        operator_delete(pFVar3,(long)local_248.
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar3);
      }
      local_248.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar10 + uVar25;
      local_248.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar10;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)__a,&local_220,__args);
      pFVar24 = __a;
    }
    __a = pFVar24 + 1;
    local_248.
    super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = __a;
    (*egl->_vptr_Library[0x2b])(egl,this->m_eglDisplay,this->m_eglSurface,0x313d);
    dVar9 = (*egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar9,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                     ,0x203);
    iVar21 = (int)uVar22;
    if (uVar22 < local_2a4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Fail, the age is invalid. Age: ",0x1f);
      this_01 = (ostream *)std::ostream::operator<<(local_1a8,local_2a4);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,", frameNdx: ",0xc);
      std::ostream::operator<<(this_01,iVar21);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::stringbuf::str();
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_298);
      if (local_298 != local_288) {
        operator_delete(local_298,(long)local_288[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_00e70e26:
      bVar6 = false;
    }
    else {
      if (iStack_260._M_current == local_258) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_268,iStack_260,(int *)&local_2a4);
      }
      else {
        *iStack_260._M_current = local_2a4;
        iStack_260._M_current = iStack_260._M_current + 1;
      }
      if ((int)local_2a4 < 1) {
        (*egl->_vptr_Library[0x2e])(egl,this->m_eglDisplay,this->m_eglSurface,0,0);
        dVar9 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar9,"setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x227);
        (*(this->m_gl).clearColor)
                  (local_278.m_data[0],local_278.m_data[1],local_278.m_data[2],local_278.m_data[3]);
        (*(this->m_gl).clear)(0x4000);
      }
      else {
        if (this->m_supportBufferAge == true) {
          getDamageRegion(local_1a8,&local_220,10,10,10,10);
          piVar13 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppiVar12 = (pointer *)
                     local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar26 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          getDamageRegion(local_1a8,&local_220,0,0,0,0);
          piVar5 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          piVar4 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar13 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppiVar12 = (pointer *)
                     local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar26 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ppiVar12 = (pointer *)operator_new(0x10);
            *ppiVar12 = (pointer)0x0;
            ppiVar12[1] = (pointer)0x0;
            piVar13 = (pointer)(ppiVar12 + 2);
            piVar26 = piVar13;
            if ((pointer *)piVar4 != (pointer *)0x0) {
              operator_delete(piVar4,(long)piVar5 - (long)piVar4);
            }
          }
        }
        iVar1 = (int)((ulong)((long)piVar13 - (long)ppiVar12) >> 2);
        iVar16 = iVar1 + 3;
        if (-1 < iVar1) {
          iVar16 = iVar1;
        }
        (*egl->_vptr_Library[0x2e])
                  (egl,this->m_eglDisplay,this->m_eglSurface,ppiVar12,(ulong)(uint)(iVar16 >> 2));
        dVar9 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar9,
                         "setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x223);
        local_200 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        if (ppiVar12 != (pointer *)0x0) {
          operator_delete(ppiVar12,(long)piVar26 - (long)ppiVar12);
        }
      }
      iVar1 = local_29c;
      if (uVar22 < 10) {
        GLES2Renderer::render(this->m_gles2Renderer,local_2a0,local_29c,&local_220);
      }
      else {
        local_298 = (int **)0x0;
        iStack_290._M_current = (int *)0x0;
        local_288[0] = (int *)0x0;
        iVar16 = *(int *)((long)local_268 + uVar22 * 4);
        if (iVar16 != 0) {
          uVar17 = uVar22 & 0xffffffff;
          pvVar14 = local_268;
          do {
            iVar16 = (int)uVar17 - iVar16;
            local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar16);
            if (iStack_290._M_current == local_288[0]) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_298,iStack_290,(int *)local_1a8);
              pvVar14 = local_268;
            }
            else {
              *iStack_290._M_current = iVar16;
              iStack_290._M_current = iStack_290._M_current + 1;
            }
            uVar17 = (ulong)(int)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            iVar16 = *(int *)((long)pvVar14 + uVar17 * 4);
          } while (iVar16 != 0);
          ppiVar18 = (int **)((long)iStack_290._M_current + -4);
          ppiVar20 = local_298;
          if (local_298 < ppiVar18 && local_298 != (int **)iStack_290._M_current) {
            do {
              ppiVar15 = (int **)((long)ppiVar20 + 4);
              iVar16 = *(int *)ppiVar20;
              *(int *)ppiVar20 = *(int *)ppiVar18;
              *(int *)ppiVar18 = iVar16;
              ppiVar18 = (int **)((long)ppiVar18 + -4);
              ppiVar20 = ppiVar15;
            } while (ppiVar15 < ppiVar18);
          }
        }
        clearColorReference(&local_1f8,&local_278);
        pFVar3 = local_248.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar19 = extraout_RDX_00;
        ppiVar20 = local_298;
        if (local_298 != (int **)iStack_290._M_current) {
          do {
            ReferenceRenderer::render
                      ((ReferenceRenderer *)&local_1f8,(Surface *)(pFVar3 + *(int *)ppiVar20),
                       pFVar19);
            ppiVar20 = (int **)((long)ppiVar20 + 4);
            pFVar19 = extraout_RDX_01;
          } while (ppiVar20 != (int **)iStack_290._M_current);
        }
        GLES2Renderer::render(this->m_gles2Renderer,local_2a0,iVar1,&local_220);
        ReferenceRenderer::render((ReferenceRenderer *)&local_1f8,(Surface *)&local_220,frame);
        anon_unknown_0::readPixels((Functions *)(this->m_gl).readPixels,&local_1d0);
        bVar6 = compareToReference(local_1e0,&local_1f8,&local_1d0,iVar21,iVar21);
        if (!bVar6) {
          local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)&local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Fail, render result is wrong. Buffer age is ","");
          std::__cxx11::string::append((char *)local_1a8);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,
                     (char *)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
          if ((pointer *)
              local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_298 != (int **)0x0) {
            operator_delete(local_298,(long)local_288[0] - (long)local_298);
          }
          goto LAB_00e70e26;
        }
        if (local_298 != (int **)0x0) {
          operator_delete(local_298,(long)local_288[0] - (long)local_298);
        }
      }
      (*egl->_vptr_Library[0x31])(egl,this->m_eglDisplay,this->m_eglSurface);
      dVar9 = (*egl->_vptr_Library[0x1f])();
      bVar6 = true;
      eglu::checkError(dVar9,"swapBuffers(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                       ,0x244);
    }
    if (local_220.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_220.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_1f8);
    tcu::Surface::~Surface(&local_1d0);
    if (!bVar6) goto LAB_00e7135b;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x14);
  description = "Fail, claim to support partial_update but buffer age is always 0";
  if ((local_200 & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(byte)local_200 & QP_TEST_RESULT_FAIL,description);
LAB_00e7135b:
  if (local_268 != (void *)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_248);
  return STOP;
}

Assistant:

TestCase::IterateResult PartialUpdateTest::iterate (void)
{
	de::Random		rnd				(m_seed);
	const Library&	egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log				= m_testCtx.getLog();
	const int		width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed		= rnd.getFloat();
	const float		clearGreen		= rnd.getFloat();
	const float		clearBlue		= rnd.getFloat();
	const tcu::Vec4	clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames		= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;
	bool			hasPositiveAge  = false;

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface	currentBuffer	 (width, height);
		tcu::Surface	refBuffer		 (width, height);
		Frame			newFrame		 (width, height);
		EGLint			currentBufferAge = -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		if (currentBufferAge > 0)
		{
			vector<EGLint>	damageRegion;

			hasPositiveAge = true;

			if (m_supportBufferAge)
			{
				damageRegion = getDamageRegion(newFrame, 10, 10, 10, 10);
			}
			else
			{
				damageRegion = getDamageRegion(newFrame, 0, 0, 0, 0);
				// Set empty damage region to avoid invalidating the framebuffer. The damage area is invalidated
				// if the buffer age extension is not supported.
				if (damageRegion.size() == 0)
					damageRegion = vector<EGLint>(4, 0);
			}

			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));
		}
		else
		{
			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0));
			clearColorScreen(m_gl, clearColor);
		}

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
			m_gles2Renderer->render(width, height, newFrame);
		else // do verification in the second half
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);

			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			m_gles2Renderer->render(width, height, newFrame);
			m_refRenderer->render(&refBuffer, newFrame);

			readPixels(m_gl, &currentBuffer);

			if (!compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx))
			{
				string errorMessage("Fail, render result is wrong. Buffer age is ");
				errorMessage += (m_supportBufferAge ? "supported" : "not supported");
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, errorMessage.c_str());
				return STOP;
			}
		}
		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));
	}

	if (!hasPositiveAge) // fraud behavior, pretend to support partial_update
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, claim to support partial_update but buffer age is always 0");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}